

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O0

bool __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::MapToNeighSide<double>
          (TPZGeoBlend<pzgeom::TPZGeoLinear> *this,int side,int SideDim,TPZVec<double> *InternalPar,
          TPZVec<double> *NeighPar,TPZFMatrix<double> *JacNeighSide)

{
  bool bVar1;
  TPZFMatrix<double> *pTVar2;
  int64_t iVar3;
  int64_t iVar4;
  TPZVec<double> *in_RCX;
  int in_EDX;
  int64_t in_RDI;
  long *in_R8;
  TPZGeoBlend<pzgeom::TPZGeoLinear> *in_R9;
  TPZTransform<double> tr;
  bool check;
  TPZManVector<double,_3> SidePar;
  TPZFNMatrix<9,_double> JacSide;
  int in_stack_fffffffffffffcdc;
  TPZGeoBlend<pzgeom::TPZGeoLinear> *in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  TPZSavable in_stack_fffffffffffffd00;
  TPZVec<double> *in_stack_fffffffffffffd08;
  TPZSavable in_stack_fffffffffffffd10;
  TPZBaseMatrix local_110 [7];
  TPZGeoBlend<pzgeom::TPZGeoLinear> *local_30;
  long *local_28;
  TPZVec<double> *local_20;
  int local_18;
  int local_14 [4];
  byte local_1;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_EDX;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            ((TPZFNMatrix<9,_double> *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0)
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffd00._vptr_TPZSavable,in_RDI);
  bVar1 = pztopology::TPZLine::CheckProjectionForSingularity<double>(local_14,local_20);
  pztopology::TPZLine::MapToSide<double>
            (tr.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix._28_4_,
             (TPZVec<double> *)
             tr.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol,
             (TPZVec<double> *)
             tr.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow,
             (TPZFMatrix<double> *)
             tr.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
             super_TPZSavable._vptr_TPZSavable);
  if (bVar1) {
    (**(code **)(*local_28 + 0x18))(local_28,(long)local_18);
    TPZTransform<double>::TPZTransform
              ((TPZTransform<double> *)in_stack_fffffffffffffd00._vptr_TPZSavable);
    TransfBetweenNeigh<double>
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,(TPZTransform<double> *)0x165be25
              );
    TPZTransform<double>::Apply
              ((TPZTransform<double> *)in_stack_fffffffffffffd10._vptr_TPZSavable,
               in_stack_fffffffffffffd08,
               (TPZVec<double> *)in_stack_fffffffffffffd00._vptr_TPZSavable);
    (*(local_30->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.
      super_TPZSavable._vptr_TPZSavable[0xd])(local_30,0);
    TransfBetweenNeigh<double>
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,(TPZTransform<double> *)0x165be73
              );
    in_stack_fffffffffffffce0 = local_30;
    pTVar2 = TPZTransform<double>::Mult((TPZTransform<double> *)&stack0xfffffffffffffd00);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)pTVar2);
    iVar4 = TPZBaseMatrix::Cols(local_110);
    (*(in_stack_fffffffffffffce0->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.
      super_TPZLine.super_TPZSavable._vptr_TPZSavable[0xd])(in_stack_fffffffffffffce0,iVar3,iVar4);
    pTVar2 = TPZTransform<double>::Mult((TPZTransform<double> *)&stack0xfffffffffffffd00);
    (*(pTVar2->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x25])
              (pTVar2,local_110,local_30,0);
    local_1 = 1;
    TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x165bf08);
  }
  else {
    local_1 = 0;
  }
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffce0);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x165bf44);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool
    pzgeom::TPZGeoBlend<TGeo>::MapToNeighSide(int side, int SideDim, TPZVec<T> &InternalPar, TPZVec<T> &NeighPar,
                                              TPZFMatrix<T> &JacNeighSide) const {
        TPZFNMatrix<9, T> JacSide;

        TPZManVector<T, 3> SidePar(SideDim);
        const bool check = TGeo::CheckProjectionForSingularity(side, InternalPar);

        this->MapToSide(side, InternalPar, SidePar, JacSide);
        if (!check) {
            #ifdef PZ_LOG2
            td::stringstream sout;
            sout << "side " << side << std::endl;
            sout << "InternalPar: ";
            for(int i = 0; i < InternalPar.NElements(); i++) sout << InternalPar[i] << "\t";
            sout << "\n";
            sout << "\tmapping is not regular"<<std::endl;
            LOGPZ_DEBUG(logger,sout.str())
            #endif
            return false;
        }
#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "side " << side << std::endl;
            sout << "InternalPar: ";
            for(int i = 0; i < InternalPar.NElements(); i++) sout << InternalPar[i] << "\t";
            sout << "\n";

            sout << "SidePar: ";
            for(int i = 0; i < SidePar.NElements(); i++) sout << SidePar[i] << "\t";
            sout << "\n";

            JacSide.Print("JacSide = ",sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

        NeighPar.Resize(SideDim);
        TPZTransform<T> tr;
        TransfBetweenNeigh(side, tr);
        tr.Apply(SidePar, NeighPar);

        JacNeighSide.Resize(0, 0);
        TransfBetweenNeigh(side, tr);
        JacNeighSide.Resize(tr.Mult().Rows(), JacSide.Cols());
        tr.Mult().Multiply(JacSide, JacNeighSide);

#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            
            sout << "NeighPar: ";
            for(int i = 0; i < NeighPar.NElements(); i++) sout << NeighPar[i] << "\t";
            sout << "\n";
            
            JacNeighSide.Print("JacNeighSide = ",sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

        return true;
    }